

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(BlockedRead *this)

{
  uint64_t in_RDX;
  long in_RSI;
  
  anon_unknown_123::AsyncPipe::BlockedRead::tryPumpFrom
            ((BlockedRead *)this,(AsyncInputStream *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

Maybe<Promise<uint64_t>> tryPumpFrom(AsyncInputStream& input, uint64_t amount) override {
      // Note: Pumps drop all capabilities.
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      KJ_ASSERT(minBytes > readSoFar.byteCount);
      auto minToRead = kj::min(amount, minBytes - readSoFar.byteCount);
      auto maxToRead = kj::min(amount, readBuffer.size());

      return canceler.wrap(input.tryRead(readBuffer.begin(), minToRead, maxToRead)
          .then([this,&input,amount](size_t actual) -> Promise<uint64_t> {
        readBuffer = readBuffer.slice(actual, readBuffer.size());
        readSoFar.byteCount += actual;

        if (readSoFar.byteCount >= minBytes) {
          // We've read enough to close out this read (readSoFar >= minBytes).
          canceler.release();
          fulfiller.fulfill(kj::cp(readSoFar));
          pipe.endState(*this);

          if (actual < amount) {
            // We didn't read as much data as the pump requested, but we did fulfill the read, so
            // we don't know whether we reached EOF on the input. We need to continue the pump,
            // replacing the BlockedRead state.
            return input.pumpTo(pipe, amount - actual)
                .then([actual](uint64_t actual2) -> uint64_t { return actual + actual2; });
          } else {
            // We pumped as much data as was requested, so we can return that now.
            return actual;
          }
        } else {
          // The pump completed without fulfilling the read. This either means that the pump
          // reached EOF or the `amount` requested was not enough to satisfy the read in the first
          // place. Pumps do not propagate EOF, so either way we want to leave the BlockedRead in
          // place waiting for more data.
          return actual;
        }
      }, teeExceptionPromise<uint64_t>(fulfiller, canceler)));
    }